

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this,
          TypedID<(spirv_cross::Types)0> *start_erase,TypedID<(spirv_cross::Types)0> *end_erase)

{
  size_t sVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  size_t new_size;
  TypedID<(spirv_cross::Types)0> *end_erase_local;
  TypedID<(spirv_cross::Types)0> *start_erase_local;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_local;
  
  pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                     (&this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  if (end_erase == pTVar2) {
    pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                       (&this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    resize(this,(long)start_erase - (long)pTVar2 >> 2);
  }
  else {
    sVar1 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size;
    pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                       (&this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    ::std::
    move<spirv_cross::TypedID<(spirv_cross::Types)0>*,spirv_cross::TypedID<(spirv_cross::Types)0>*>
              (end_erase,pTVar2,start_erase);
    resize(this,sVar1 - ((long)end_erase - (long)start_erase >> 2));
  }
  return;
}

Assistant:

void erase(T *start_erase, T *end_erase) SPIRV_CROSS_NOEXCEPT
	{
		if (end_erase == this->end())
		{
			resize(size_t(start_erase - this->begin()));
		}
		else
		{
			auto new_size = this->buffer_size - (end_erase - start_erase);
			std::move(end_erase, this->end(), start_erase);
			resize(new_size);
		}
	}